

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>
::PropagateResult(ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>
                  *this,BasicFlatConverter *cvt,int i,double lb,double ub,Context ctx)

{
  bool bVar1;
  Context CVar2;
  reference this_00;
  undefined8 uVar3;
  undefined8 in_RSI;
  SOS_1or2_Constraint<1> *in_RDI;
  exception *exc;
  Context ctx_redef;
  size_type in_stack_fffffffffffffe48;
  ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>
  *in_stack_fffffffffffffe50;
  Context *in_stack_fffffffffffffe58;
  Context in_stack_fffffffffffffe64;
  double in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe8c;
  Context in_stack_fffffffffffffe94;
  Error *in_stack_fffffffffffffe98;
  CStringRef in_stack_fffffffffffffea0;
  BasicCStringRef<char> local_50;
  CtxVal local_48;
  Context local_34 [8];
  int iStack_14;
  
  iStack_14 = (int)((ulong)in_RSI >> 0x20);
  this_00 = std::
            deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>::Container>_>
            ::operator[]((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>::Container,_std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::SOS_1or2_Constraint<1>_>::Container>_>
                          *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  CVar2 = Container::GetRedefContext(this_00);
  local_34[0] = CVar2;
  bVar1 = Context::IsNone(local_34);
  if (!bVar1) {
    local_48 = local_34[0].value_;
    in_stack_fffffffffffffe7f =
         Context::IsSubsetOf(in_stack_fffffffffffffe58,in_stack_fffffffffffffe64);
    if (!(bool)in_stack_fffffffffffffe7f) {
      uVar3 = __cxa_allocate_exception(0x18);
      fmt::BasicCStringRef<char>::BasicCStringRef
                (&local_50,
                 "Part of expression redefinition\ncould be lost. Please contact\nAMPL customer support."
                );
      Error::Error(in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                   in_stack_fffffffffffffe94.value_);
      __cxa_throw(uVar3,&Error::typeinfo,Error::~Error);
    }
  }
  GetConstraint(in_stack_fffffffffffffe50,iStack_14);
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::PropagateResult<1>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)CONCAT44(in_stack_fffffffffffffe8c,CVar2.value_),in_RDI,
             (double)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe94);
  return;
}

Assistant:

void PropagateResult(BasicFlatConverter& cvt,
                       int i,
                       double lb, double ub, Context ctx) override {
    try {
      // Too strong: instead, differentiate context
      // in which the redefinition happened #248.
      // MP_ASSERT_ALWAYS(ctx.IsSubsetOf(GetContext())
      //                  || IsBridgingToBeConsidered(i),
      auto ctx_redef = cons_[i].GetRedefContext();
      MP_ASSERT_ALWAYS(ctx_redef.IsNone()
                           || ctx.IsSubsetOf(ctx_redef),
                       "Part of expression redefinition\n"
                       "could be lost. Please contact\n"
                       "AMPL customer support.");
      static_cast<Converter&>(cvt).PropagateResult(
            GetConstraint(i), lb, ub, ctx);
    } catch (const std::exception& exc) {
      MP_RAISE(Converter::GetTypeName() +
               std::string(": propagating result for constraint ") +
               std::to_string(i) + "\nof type '" +
               Constraint::GetTypeName() +
               "':\n" + exc.what());
    }
  }